

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void Wasm::WasmBytecodeGenerator::GenerateFunctionBytecode
               (ScriptContext *scriptContext,WasmReaderInfo *readerinfo,bool validateOnly)

{
  undefined1 local_180 [8];
  WasmBytecodeGenerator generator;
  
  WasmBytecodeGenerator((WasmBytecodeGenerator *)local_180,scriptContext,readerinfo,validateOnly);
  GenerateFunction((WasmBytecodeGenerator *)local_180);
  generator.m_blockInfos.list._40_8_ = &PTR_IsReadOnly_01543b08;
  if (generator.m_evalStack.list.
      super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList
      != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               generator.m_evalStack.list.
               super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>._16_8_,
               generator.m_evalStack.list.
               super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.
               _vptr_ReadOnlyList,
               (long)(int)generator.m_evalStack.list.
                          super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          .alloc << 3);
    generator.m_evalStack.list.
    super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
         (_func_int **)0x0;
    generator.m_evalStack.list.
    super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer._0_4_ = 0;
    generator.m_evalStack.list.
    super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc._0_4_ = 0;
  }
  generator._264_8_ = &PTR_IsReadOnly_01543b60;
  if (generator.m_blockInfos.list.
      super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList != (_func_int **)0x0) {
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
               generator.m_blockInfos.list.
               super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>._16_8_
               ,generator.m_blockInfos.list.
                super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.
                _vptr_ReadOnlyList,
               (long)(int)generator.m_blockInfos.list.
                          super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                          .alloc << 3);
    generator.m_blockInfos.list.
    super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.
    _vptr_ReadOnlyList = (_func_int **)0x0;
    generator.m_blockInfos.list.
    super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer._0_4_ = 0;
    generator.m_blockInfos.list.
    super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.alloc._0_4_ = 0;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)&generator);
  return;
}

Assistant:

void WasmBytecodeGenerator::GenerateFunctionBytecode(Js::ScriptContext* scriptContext, WasmReaderInfo* readerinfo, bool validateOnly /*= false*/)
{
    WasmBytecodeGenerator generator(scriptContext, readerinfo, validateOnly);
    generator.GenerateFunction();
}